

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu.h
# Opt level: O0

int basisu::vector_find<basisu::vector<unsigned_int>>
              (vector<unsigned_int> *vec,value_type_conflict *obj)

{
  uint32_t uVar1;
  uint *puVar2;
  uint *in_RSI;
  vector<unsigned_int> *in_RDI;
  size_t i;
  vector<unsigned_int> *i_00;
  vector<unsigned_int> *this;
  
  uVar1 = vector<unsigned_int>::size(in_RDI);
  if (0x7fffffff < uVar1) {
    __assert_fail("vec.size() <= INT_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu.h"
                  ,0xd5,
                  "int basisu::vector_find(const T &, const typename T::value_type &) [T = basisu::vector<unsigned int>]"
                 );
  }
  i_00 = (vector<unsigned_int> *)0x0;
  while( true ) {
    this = i_00;
    uVar1 = vector<unsigned_int>::size(in_RDI);
    if ((vector<unsigned_int> *)(ulong)uVar1 <= i_00) {
      return -1;
    }
    puVar2 = vector<unsigned_int>::operator[](this,(size_t)i_00);
    if (*puVar2 == *in_RSI) break;
    i_00 = (vector<unsigned_int> *)((long)&this->m_p + 1);
  }
  return (int)this;
}

Assistant:

int vector_find(const T &vec, const typename T::value_type &obj)
	{
		assert(vec.size() <= INT_MAX);
		for (size_t i = 0; i < vec.size(); i++)
			if (vec[i] == obj)
				return static_cast<int>(i);
		return -1;
	}